

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

VTableValue Lowerer::GetArrayVtableAddress(ValueType valueType,bool getVirtual)

{
  code *pcVar1;
  bool bVar2;
  ObjectType OVar3;
  undefined4 *puVar4;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_1a [4];
  ValueType valueType_local;
  
  local_1a[0] = valueType.field_0;
  bVar2 = ValueType::IsLikelyAnyOptimizedArray((ValueType *)&local_1a[0].field_0);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3b2d,"(valueType.IsLikelyAnyOptimizedArray())",
                       "valueType.IsLikelyAnyOptimizedArray()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  bVar2 = ValueType::IsLikelyArrayOrObjectWithArray((ValueType *)&local_1a[0].field_0);
  if (bVar2) {
    bVar2 = ValueType::HasIntElements((ValueType *)&local_1a[0].field_0);
    if (bVar2) {
      return VtableNativeIntArray;
    }
    bVar2 = ValueType::HasFloatElements((ValueType *)&local_1a[0].field_0);
    if (bVar2) {
      return VtableNativeFloatArray;
    }
  }
  if ((getVirtual) &&
     (bVar2 = ValueType::IsLikelyMixedTypedArrayType((ValueType *)&local_1a[0].field_0), bVar2)) {
    OVar3 = ValueType::GetMixedToVirtualTypedArrayObjectType((ValueType *)&local_1a[0].field_0);
  }
  else {
    OVar3 = ValueType::GetObjectType((ValueType *)&local_1a[0].field_0);
  }
  return VtableAddresses[OVar3];
}

Assistant:

VTableValue Lowerer::GetArrayVtableAddress(const ValueType valueType, bool getVirtual)
{
    Assert(valueType.IsLikelyAnyOptimizedArray());
    if(valueType.IsLikelyArrayOrObjectWithArray())
    {
        if(valueType.HasIntElements())
        {
            return VTableValue::VtableNativeIntArray;
        }
        else if(valueType.HasFloatElements())
        {
            return VTableValue::VtableNativeFloatArray;
        }
    }
    if (getVirtual && valueType.IsLikelyMixedTypedArrayType())
    {
        return VtableAddresses[static_cast<ValueType::TSize>(valueType.GetMixedToVirtualTypedArrayObjectType())];
    }
    return VtableAddresses[static_cast<ValueType::TSize>(valueType.GetObjectType())];
}